

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::init(BaseLineCase *this,EVP_PKEY_CTX *ctx)

{
  vector<float,_std::allocator<float>_> *this_00;
  ostringstream *this_01;
  int iVar1;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  allocator<char> local_1b1;
  float range [2];
  undefined1 local_1a8 [384];
  
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    range[0] = 0.0;
    range[1] = 0.0;
    iVar1 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x818))(0x846e,range);
    local_1a8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"ALIASED_LINE_WIDTH_RANGE = [");
    std::ostream::operator<<(this_01,range[0]);
    std::operator<<((ostream *)this_01,", ");
    std::ostream::operator<<(this_01,range[1]);
    std::operator<<((ostream *)this_01,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    if (range[1] <= 1.0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"wide line support required",&local_1b1);
      tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1a8);
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    ctx = (EVP_PKEY_CTX *)(range + 1);
    this_00 = &this->m_lineWidths;
    local_1a8._0_4_ = 5.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,(float *)local_1a8);
    local_1a8._0_4_ = 0x41200000;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,(float *)local_1a8);
    std::vector<float,_std::allocator<float>_>::push_back(this_00,(value_type_conflict2 *)ctx);
    this->m_maxLineWidth = range[1];
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    ctx = (EVP_PKEY_CTX *)(long)this->m_iterationCount;
    local_1a8._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->m_lineWidths,(size_type)ctx,(value_type_conflict2 *)local_1a8);
  }
  iVar1 = BaseRenderingCase::init(&this->super_BaseRenderingCase,ctx);
  return iVar1;
}

Assistant:

void BaseLineCase::init (void)
{
	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			throw tcu::NotSupportedError("wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);

	// init parent
	BaseRenderingCase::init();
}